

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O3

void optimize(opt_object obj,custom_function *funcpt,custom_gradient *funcgrad,int N,double *xi,
             int method)

{
  char *pcVar1;
  int *niter;
  double *dx;
  ulong uVar2;
  int iVar3;
  int method_00;
  double dVar4;
  double gtol;
  double stol;
  
  dx = (double *)malloc((long)N * 8);
  if (0 < N) {
    uVar2 = 0;
    do {
      dx[uVar2] = 1.0;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  obj->Method = method;
  obj->Iter = 0;
  if (obj->N != N) {
    printf("The Object is initialized for a problem of size %d \n");
    printf("Please Reinitialize the object for the new size %d using opt_init command \n",
           (ulong)(uint)N);
LAB_0012991d:
    exit(1);
  }
  pcVar1 = obj->MethodName;
  if (7 < (uint)method) {
    builtin_strncpy(pcVar1,"NULL",5);
    puts("Method Value should be one of 0,1,2,3,4,5 or 6. See Documentation. ");
    goto LAB_0012991d;
  }
  niter = &obj->Iter;
  switch(method) {
  case 0:
    builtin_strncpy(pcVar1,"Nelder-Mead",0xc);
    iVar3 = nel_min(funcpt,xi,N,dx,1.0,obj->MaxIter,niter,obj->eps,obj->xopt);
    break;
  case 1:
    builtin_strncpy(pcVar1,"Newton Line Search",0x13);
    iVar3 = newton_min_func(funcpt,funcgrad,xi,N,dx,1.0,obj->maxstep,obj->MaxIter,niter,obj->eps,
                            obj->gtol,obj->stol,obj->xopt);
    break;
  case 2:
    builtin_strncpy(pcVar1,"Newton Trust Region - Hook Step",0x20);
    iVar3 = obj->MaxIter;
    dVar4 = obj->eps;
    gtol = obj->gtol;
    stol = obj->stol;
    method_00 = 0;
    goto LAB_001296f4;
  case 3:
    builtin_strncpy(pcVar1,"Newton Trust Region - Double Dog-Leg",0x25);
    iVar3 = obj->MaxIter;
    dVar4 = obj->eps;
    gtol = obj->gtol;
    stol = obj->stol;
    method_00 = 1;
LAB_001296f4:
    iVar3 = newton_min_trust(funcpt,funcgrad,xi,N,dx,1.0,-1.0,method_00,iVar3,niter,dVar4,gtol,stol,
                             obj->xopt);
    break;
  case 4:
    builtin_strncpy(pcVar1,"Conjugate Gradient",0x13);
    iVar3 = conjgrad_min_lin(funcpt,funcgrad,xi,N,dx,obj->maxstep,obj->MaxIter,niter,obj->eps,
                             obj->gtol,obj->ftol,obj->xtol,obj->xopt);
    break;
  case 5:
    builtin_strncpy(pcVar1,"BFGS",5);
    iVar3 = bfgs_min(funcpt,funcgrad,xi,N,dx,1.0,obj->maxstep,obj->MaxIter,niter,obj->eps,obj->gtol,
                     obj->stol,obj->xopt);
    break;
  case 6:
    builtin_strncpy(pcVar1,"Limited Memory BFGS",0x14);
    iVar3 = N;
    if ((10 < N) && (iVar3 = 10, 0x14 < (uint)N)) {
      iVar3 = (uint)(200 < (uint)N) * 5 + 0xf;
    }
    iVar3 = bfgs_l_min(funcpt,funcgrad,xi,N,iVar3,dx,1.0,obj->maxstep,obj->MaxIter,niter,obj->eps,
                       obj->gtol,obj->ftol,obj->xtol,obj->xopt);
    break;
  case 7:
    builtin_strncpy(pcVar1,"BFGS More-Thuente Line Search",0x1e);
    iVar3 = N;
    if ((10 < N) && (iVar3 = 10, 0x14 < (uint)N)) {
      iVar3 = (uint)(200 < (uint)N) * 5 + 0xf;
    }
    iVar3 = bfgs_min2(funcpt,funcgrad,xi,N,iVar3,dx,1.0,obj->maxstep,obj->MaxIter,niter,obj->eps,
                      obj->gtol,obj->ftol,obj->xtol,obj->xopt);
  }
  obj->retval = iVar3;
  dVar4 = (*funcpt->funcpt)(obj->xopt,obj->N,funcpt->params);
  obj->objfunc = dVar4;
  free(dx);
  return;
}

Assistant:

void optimize(opt_object obj, custom_function *funcpt, custom_gradient *funcgrad, int N, double *xi,
		int method) {
	int i,m;
	double fsval,delta;
	double *dx;

	dx = (double*) malloc(sizeof(double) * N);
		/*
		 * Method 0 - Nelder-Mead
		 * Method 1 - Newton Line Search
		 * Method 2 - Newton Trust Region - Hook Step
		 * Method 3 - Newton Trust Region - Double Dog-Leg
		 * Method 4 - Conjugate Gradient
		 * Method 5 - BFGS
		 * Method 6 - Limited Memory BFGS
		 * Method 7 - BFGS More-Thuente Line Search
		 */
	/*
	 * Return Codes
	 *
	 * Code 1 denotes probable success.
	 * Codes 2,3 and 6 denote possible success.
	 * Codes 0, 4 and 15 denote failure. [Code 4 my also occur in cases where the minima is realized but
	 * convergence is not achieved due to tolerance values being too small. It is recommended that you use
	 * another method if you suspect that such a scenario has occurred.]
	 *
	 * 0 - Input Error
	 * 1 - df(x)/dx <= gtol achieved so current point may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so the point may be the local minima.
	 * 3 - Global Step failed to locate a lower point than the current point so it may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence probably not achieved.
	 * 6 - Function value drops below ftol (relative functional tolerance).
	 * 15 - Overflow occurs. Try a different method.
	 *
	 */
	fsval = 1.0;
	delta = -1.0; // Trust Region default


	for(i = 0; i < N;++i) {
		dx[i] = 1.0;
	}
	obj->Method = method;
	obj->Iter = 0;

	if (obj->N != N) {
		printf("The Object is initialized for a problem of size %d \n",obj->N);
		printf("Please Reinitialize the object for the new size %d using opt_init command \n",N);
		exit(1);
	}

	if (method == 0) {
		strcpy(obj->MethodName,"Nelder-Mead");
		obj->retval = nel_min(funcpt,xi,obj->N,dx,fsval,obj->MaxIter,&obj->Iter,obj->eps,obj->xopt);
	} else if (method == 1) {
		strcpy(obj->MethodName,"Newton Line Search");
		obj->retval = newton_min_func(funcpt,funcgrad,xi,obj->N,dx,fsval,obj->maxstep,obj->MaxIter,&obj->Iter,obj->eps,obj->gtol,
				obj->stol,obj->xopt);
	} else if (method == 2) {
		strcpy(obj->MethodName,"Newton Trust Region - Hook Step");

		obj->retval = newton_min_trust(funcpt,funcgrad,xi,obj->N,dx,fsval,delta,0,obj->MaxIter,&obj->Iter,obj->eps,
				obj->gtol,obj->stol,obj->xopt);
	} else if (method == 3) {
		strcpy(obj->MethodName,"Newton Trust Region - Double Dog-Leg");

		obj->retval = newton_min_trust(funcpt,funcgrad,xi,obj->N,dx,fsval,delta,1,obj->MaxIter,&obj->Iter,obj->eps,
				obj->gtol,obj->stol,obj->xopt);
	} else if (method == 4) {
		strcpy(obj->MethodName,"Conjugate Gradient");

		obj->retval = conjgrad_min_lin(funcpt, funcgrad, xi, obj->N, dx, obj->maxstep, obj->MaxIter, &obj->Iter, obj->eps, obj->gtol,
				obj->ftol,obj->xtol,obj->xopt);
	} else if (method == 5) {
		strcpy(obj->MethodName,"BFGS");

		obj->retval = bfgs_min(funcpt, funcgrad, xi, obj->N, dx, fsval, obj->maxstep, obj->MaxIter, &obj->Iter, obj->eps, obj->gtol,
				obj->stol,obj->xopt);
	} else if (method == 6) {
		strcpy(obj->MethodName,"Limited Memory BFGS");
		m = mvalue(N);
		obj->retval = bfgs_l_min(funcpt, funcgrad, xi, obj->N, m, dx, fsval, obj->maxstep, obj->MaxIter, &obj->Iter, obj->eps,
				obj->gtol,obj->ftol,obj->xtol,obj->xopt);
	}
	else if (method == 7) {
		strcpy(obj->MethodName, "BFGS More-Thuente Line Search");
		m = mvalue(N);
		obj->retval = bfgs_min2(funcpt, funcgrad, xi, obj->N, m, dx, fsval, obj->maxstep, obj->MaxIter, &obj->Iter, obj->eps,
			obj->gtol, obj->ftol, obj->xtol, obj->xopt);
	}
	else {
		strcpy(obj->MethodName,"NULL");
		printf("Method Value should be one of 0,1,2,3,4,5 or 6. See Documentation. \n");
		exit(1);
	}

	obj->objfunc = FUNCPT_EVAL(funcpt,obj->xopt,obj->N);

	free(dx);
}